

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void InitLexer(Lexer *lexer,char *rawSourceCode)

{
  size_t sVar1;
  int local_1c;
  int i;
  char *rawSourceCode_local;
  Lexer *lexer_local;
  
  lexer->rawSourceCode = rawSourceCode;
  sVar1 = strlen(rawSourceCode);
  lexer->length = (int)sVar1;
  lexer->currentTokenString = (char *)0x0;
  (lexer->tracker).currentTokenPosition = 0;
  (lexer->tracker).tokenStart = 0;
  (lexer->tracker).tokenEnd = 0;
  (lexer->tracker).row = 1;
  (lexer->tracker).col = 1;
  lexer->previousTrackerSpot = -1;
  lexer->totalTrackers = 5;
  for (local_1c = 0; local_1c < lexer->totalTrackers; local_1c = local_1c + 1) {
    lexer->previousTrackers[local_1c].col = 0;
    lexer->previousTrackers[local_1c].row = 0;
    lexer->previousTrackers[local_1c].tokenEnd = 0;
    lexer->previousTrackers[local_1c].tokenStart = 0;
    lexer->previousTrackers[local_1c].currentTokenPosition = 0;
  }
  return;
}

Assistant:

void InitLexer(Lexer* lexer, char* rawSourceCode){
	// Init lexer
	lexer->rawSourceCode = rawSourceCode;
	lexer->length = strlen(rawSourceCode);
	lexer->currentTokenString = NULL;

	// Init lexer tracker
	lexer->tracker.currentTokenPosition = 0;
	lexer->tracker.tokenStart = 0;
	lexer->tracker.tokenEnd = 0;
	lexer->tracker.row = 1;
	lexer->tracker.col = 1;
	lexer->previousTrackerSpot = -1;
	lexer->totalTrackers = 5;

	for (int i = 0; i < lexer->totalTrackers; i++) {
		lexer->previousTrackers[i].col = 0;
		lexer->previousTrackers[i].row = 0;
		lexer->previousTrackers[i].tokenEnd = 0;
		lexer->previousTrackers[i].tokenStart = 0;
		lexer->previousTrackers[i].currentTokenPosition = 0;
	}
}